

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

Wlc_Ntk_t * Wlc_NtkAlloc(char *pName,int nObjsAlloc)

{
  Wlc_Ntk_t *pWVar1;
  Mem_Flex_t *pMVar2;
  Wlc_Obj_t *pWVar3;
  char *local_28;
  Wlc_Ntk_t *p;
  int nObjsAlloc_local;
  char *pName_local;
  
  pWVar1 = (Wlc_Ntk_t *)calloc(1,0x340);
  if (pName == (char *)0x0) {
    local_28 = (char *)0x0;
  }
  else {
    local_28 = Extra_FileNameGeneric(pName);
  }
  pWVar1->pName = local_28;
  Vec_IntGrow(&pWVar1->vPis,0x6f);
  Vec_IntGrow(&pWVar1->vPos,0x6f);
  Vec_IntGrow(&pWVar1->vCis,0x6f);
  Vec_IntGrow(&pWVar1->vCos,0x6f);
  Vec_IntGrow(&pWVar1->vFfs,0x6f);
  pMVar2 = Mem_FlexStart();
  pWVar1->pMemFanin = pMVar2;
  pWVar1->nObjsAlloc = nObjsAlloc;
  pWVar3 = (Wlc_Obj_t *)calloc((long)pWVar1->nObjsAlloc,0x18);
  pWVar1->pObjs = pWVar3;
  pWVar1->iObj = 1;
  return pWVar1;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkAlloc( char * pName, int nObjsAlloc )
{
    Wlc_Ntk_t * p;
    p = ABC_CALLOC( Wlc_Ntk_t, 1 );
    p->pName = pName ? Extra_FileNameGeneric( pName ) : NULL;
    Vec_IntGrow( &p->vPis, 111 );
    Vec_IntGrow( &p->vPos, 111 );
    Vec_IntGrow( &p->vCis, 111 );
    Vec_IntGrow( &p->vCos, 111 );
    Vec_IntGrow( &p->vFfs, 111 );
    p->pMemFanin = Mem_FlexStart();
    p->nObjsAlloc = nObjsAlloc;  
    p->pObjs = ABC_CALLOC( Wlc_Obj_t, p->nObjsAlloc );
    p->iObj = 1;
    return p;
}